

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.cpp
# Opt level: O0

void __thiscall http_server::http_server(http_server *this,epoll *ep)

{
  http_server *local_68;
  code *local_60;
  undefined8 local_58;
  type local_50;
  on_connected_t local_38;
  epoll *local_18;
  epoll *ep_local;
  http_server *this_local;
  
  this->ep = ep;
  local_60 = on_new_connection;
  local_58 = 0;
  local_68 = this;
  local_18 = ep;
  ep_local = (epoll *)this;
  std::bind<void(http_server::*)(),http_server*>
            (&local_50,(offset_in_http_server_to_subr *)&local_60,&local_68);
  std::function<void()>::function<std::_Bind<void(http_server::*(http_server*))()>,void>
            ((function<void()> *)&local_38,&local_50);
  server_socket::server_socket(&this->ss,ep,&local_38);
  std::function<void_()>::~function(&local_38);
  std::
  map<http_server::inbound_connection_*,_std::unique_ptr<http_server::inbound_connection,_std::default_delete<http_server::inbound_connection>_>,_std::less<http_server::inbound_connection_*>,_std::allocator<std::pair<http_server::inbound_connection_*const,_std::unique_ptr<http_server::inbound_connection,_std::default_delete<http_server::inbound_connection>_>_>_>_>
  ::map(&this->connections);
  return;
}

Assistant:

http_server::http_server(sysapi::epoll &ep)
    : ep(ep)
    , ss{ep, std::bind(&http_server::on_new_connection, this)}
{}